

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

ssize_t get_uncompressed_data(archive_read *a,void **buff,size_t size,size_t minimum)

{
  void *pvVar1;
  int error_number;
  ssize_t sVar2;
  ulong uVar3;
  void *pvVar4;
  char *fmt;
  ulong local_30;
  
  pvVar1 = a->format->data;
  if ((*(long *)((long)pvVar1 + 0x128) == 0) && (*(long *)((long)pvVar1 + 0x130) == -1)) {
    pvVar4 = __archive_read_ahead(a,1,(ssize_t *)&local_30);
    *buff = pvVar4;
    if (0 < (long)local_30) {
      uVar3 = *(ulong *)((long)pvVar1 + 0xf0);
      if (uVar3 <= local_30) {
        local_30 = uVar3;
      }
      if (local_30 < size) {
        size = local_30;
      }
      *(size_t *)((long)pvVar1 + 0x120) = size;
LAB_001243c7:
      *(ulong *)((long)pvVar1 + 0xf0) = uVar3 - size;
      return size;
    }
    fmt = "Truncated 7-Zip file data";
    error_number = 0x54;
  }
  else {
    pvVar4 = *(void **)((long)pvVar1 + 0xe0);
    if (pvVar4 != (void *)0x0) {
      uVar3 = *(ulong *)((long)pvVar1 + 0xf0);
      if (uVar3 < minimum) {
        sVar2 = extract_pack_stream(a,minimum);
        if (sVar2 < 0) {
          return -0x1e;
        }
        pvVar4 = *(void **)((long)pvVar1 + 0xe0);
        uVar3 = *(ulong *)((long)pvVar1 + 0xf0);
      }
      if (uVar3 < size) {
        size = uVar3;
      }
      *buff = pvVar4;
      *(long *)((long)pvVar1 + 0xe0) = *(long *)((long)pvVar1 + 0xe0) + size;
      goto LAB_001243c7;
    }
    fmt = "Damaged 7-Zip archive";
    error_number = -1;
  }
  archive_set_error(&a->archive,error_number,fmt);
  return -0x1e;
}

Assistant:

static ssize_t
get_uncompressed_data(struct archive_read *a, const void **buff, size_t size,
    size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		/* Copy mode. */

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		*buff = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file data");
			return (ARCHIVE_FATAL);
		}
		if ((size_t)bytes_avail >
		    zip->uncompressed_buffer_bytes_remaining)
			bytes_avail = (ssize_t)
			    zip->uncompressed_buffer_bytes_remaining;
		if ((size_t)bytes_avail > size)
			bytes_avail = (ssize_t)size;

		zip->pack_stream_bytes_unconsumed = bytes_avail;
	} else if (zip->uncompressed_buffer_pointer == NULL) {
		/* Decompression has failed. */
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	} else {
		/* Packed mode. */
		if (minimum > zip->uncompressed_buffer_bytes_remaining) {
			/*
			 * If remaining uncompressed data size is less than
			 * the minimum size, fill the buffer up to the
			 * minimum size.
			 */
			if (extract_pack_stream(a, minimum) < 0)
				return (ARCHIVE_FATAL);
		}
		if (size > zip->uncompressed_buffer_bytes_remaining)
			bytes_avail = (ssize_t)
			    zip->uncompressed_buffer_bytes_remaining;
		else
			bytes_avail = (ssize_t)size;
		*buff = zip->uncompressed_buffer_pointer;
		zip->uncompressed_buffer_pointer += bytes_avail;
	}
	zip->uncompressed_buffer_bytes_remaining -= bytes_avail;
	return (bytes_avail);
}